

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O3

void __thiscall
amrex::FaceLinear::interp_arr
          (FaceLinear *this,Array<FArrayBox_*,_3> *crse,int crse_comp,Array<FArrayBox_*,_3> *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Array<IArrayBox_*,_3> *solve_mask,
          Geometry *param_9,Geometry *param_10,
          Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
          *param_11,int param_12,int param_13,RunOn runon)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined8 *puVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  bool bVar24;
  double dVar25;
  Box bx;
  Array<IndexType,_3> types;
  GpuArray<amrex::Array4<double>,_3U> fine_arr;
  GpuArray<amrex::Array4<const_int>,_3U> mask_arr;
  GpuArray<amrex::Array4<const_double>,_3U> crse_arr;
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint auStack_33c [2];
  undefined8 uStack_334;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint auStack_31c [2];
  undefined8 uStack_314;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint auStack_2fc [2];
  undefined8 uStack_2f4;
  undefined8 auStack_29c [2];
  uint local_288;
  undefined8 uStack_284;
  undefined8 local_27c;
  undefined4 local_274;
  long local_270 [4];
  int local_250 [3];
  ulong uStack_244;
  int aiStack_23c [3];
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  int local_210;
  int local_20c;
  int local_208;
  long local_1f0;
  long local_1e8;
  undefined1 local_1e0 [8];
  undefined1 local_1d8 [8];
  int local_1d0;
  int local_1cc;
  int local_1c8;
  undefined8 auStack_1c4 [2];
  undefined4 uStack_1b4;
  long local_1b0 [4];
  int local_190 [3];
  ulong uStack_184;
  undefined4 auStack_17c [3];
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  int local_150;
  int local_14c;
  int local_148;
  long local_130;
  long local_128;
  undefined1 local_120 [8];
  undefined1 local_118 [8];
  int local_110;
  int local_10c;
  int local_108;
  undefined8 auStack_104 [2];
  undefined4 uStack_f4;
  long local_f0 [4];
  int local_d0 [3];
  ulong uStack_c4;
  int aiStack_bc [3];
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  int local_90;
  int local_8c;
  int local_88;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  int local_50;
  int local_4c;
  int local_48;
  
  uStack_284._4_4_ = 0;
  _local_288 = 0;
  lVar11 = 0;
  do {
    (&local_288)[lVar11] = (&local_288)[lVar11] | 1 << ((byte)lVar11 & 0x1f);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  lVar11 = 0x2c;
  do {
    *(undefined8 *)((long)&local_10c + lVar11) = 0;
    *(undefined8 *)((long)auStack_104 + lVar11) = 0;
    *(undefined8 *)(local_120 + lVar11 + 4) = 0;
    *(undefined8 *)(local_118 + lVar11 + 4) = 0;
    *(undefined8 *)((long)auStack_104 + lVar11 + 8) = 0x100000001;
    *(undefined4 *)((long)&uStack_f4 + lVar11) = 1;
    *(undefined8 *)((long)local_f0 + lVar11) = 0;
    *(undefined8 *)((long)local_f0 + lVar11 + 8) = 0;
    lVar11 = lVar11 + 0x40;
  } while (lVar11 != 0xec);
  lVar11 = 0x2c;
  do {
    *(undefined8 *)(&stack0xfffffffffffffd74 + lVar11) = 0;
    *(undefined8 *)((long)&uStack_284 + lVar11) = 0;
    *(undefined8 *)((long)auStack_29c + lVar11) = 0;
    *(undefined8 *)((long)auStack_29c + lVar11 + 8) = 0;
    *(undefined8 *)((long)&local_27c + lVar11) = 0x100000001;
    *(undefined4 *)((long)&local_274 + lVar11) = 1;
    *(undefined8 *)((long)local_270 + lVar11) = 0;
    *(undefined8 *)((long)local_270 + lVar11 + 8) = 0;
    lVar11 = lVar11 + 0x40;
  } while (lVar11 != 0xec);
  lVar11 = 0x2c;
  do {
    *(undefined8 *)((long)&local_1cc + lVar11) = 0;
    *(undefined8 *)((long)auStack_1c4 + lVar11) = 0;
    *(undefined8 *)(local_1e0 + lVar11 + 4) = 0;
    *(undefined8 *)(local_1d8 + lVar11 + 4) = 0;
    *(undefined8 *)((long)auStack_1c4 + lVar11 + 8) = 0x100000001;
    *(undefined4 *)((long)&uStack_1b4 + lVar11) = 1;
    *(undefined8 *)((long)local_1b0 + lVar11) = 0;
    *(undefined8 *)((long)local_1b0 + lVar11 + 8) = 0;
    lVar11 = lVar11 + 0x40;
  } while (lVar11 != 0xec);
  lVar11 = 0;
  do {
    lVar23 = *(long *)((long)crse->_M_elems + lVar11);
    iVar1 = *(int *)(lVar23 + 0x20);
    uVar4 = *(undefined8 *)(lVar23 + 0x18);
    lVar19 = (long)*(int *)(lVar23 + 0x28) + 1;
    iVar21 = *(int *)(lVar23 + 0x24);
    lVar22 = (long)*(int *)(lVar23 + 0x2c) + 1;
    lVar17 = ((long)iVar21 - (long)*(int *)(lVar23 + 0x18)) + 1;
    lVar20 = (lVar19 - *(int *)(lVar23 + 0x1c)) * lVar17;
    lVar15 = (lVar22 - iVar1) * lVar20;
    iVar2 = *(int *)(lVar23 + 0x34);
    local_f0[lVar11] = lVar15 * crse_comp * 8 + *(long *)(lVar23 + 0x10);
    local_f0[lVar11 + 1] = lVar17;
    local_f0[lVar11 + 2] = lVar20;
    local_f0[lVar11 + 3] = lVar15;
    *(undefined8 *)(local_d0 + lVar11 * 2) = uVar4;
    local_d0[lVar11 * 2 + 2] = iVar1;
    (&uStack_c4)[lVar11] = (ulong)(iVar21 + 1) | lVar19 << 0x20;
    aiStack_bc[lVar11 * 2] = (int)lVar22;
    aiStack_bc[lVar11 * 2 + 1] = iVar2 - crse_comp;
    lVar23 = *(long *)((long)fine->_M_elems + lVar11);
    iVar1 = *(int *)(lVar23 + 0x20);
    uVar4 = *(undefined8 *)(lVar23 + 0x18);
    lVar19 = (long)*(int *)(lVar23 + 0x28) + 1;
    iVar21 = *(int *)(lVar23 + 0x24);
    lVar22 = (long)*(int *)(lVar23 + 0x2c) + 1;
    lVar17 = ((long)iVar21 - (long)*(int *)(lVar23 + 0x18)) + 1;
    lVar20 = (lVar19 - *(int *)(lVar23 + 0x1c)) * lVar17;
    lVar15 = (lVar22 - iVar1) * lVar20;
    iVar2 = *(int *)(lVar23 + 0x34);
    local_270[lVar11] = lVar15 * fine_comp * 8 + *(long *)(lVar23 + 0x10);
    local_270[lVar11 + 1] = lVar17;
    local_270[lVar11 + 2] = lVar20;
    local_270[lVar11 + 3] = lVar15;
    *(undefined8 *)(local_250 + lVar11 * 2) = uVar4;
    local_250[lVar11 * 2 + 2] = iVar1;
    (&uStack_244)[lVar11] = (ulong)(iVar21 + 1) | lVar19 << 0x20;
    aiStack_23c[lVar11 * 2] = (int)lVar22;
    aiStack_23c[lVar11 * 2 + 1] = iVar2 - fine_comp;
    lVar23 = *(long *)((long)solve_mask->_M_elems + lVar11);
    if (lVar23 != 0) {
      uVar3 = *(undefined4 *)(lVar23 + 0x34);
      iVar1 = *(int *)(lVar23 + 0x20);
      uVar4 = *(undefined8 *)(lVar23 + 0x18);
      lVar19 = (long)*(int *)(lVar23 + 0x28) + 1;
      iVar21 = *(int *)(lVar23 + 0x24);
      lVar15 = (long)*(int *)(lVar23 + 0x2c) + 1;
      lVar17 = ((long)iVar21 - (long)*(int *)(lVar23 + 0x18)) + 1;
      lVar20 = (lVar19 - *(int *)(lVar23 + 0x1c)) * lVar17;
      local_1b0[lVar11] = *(long *)(lVar23 + 0x10);
      local_1b0[lVar11 + 1] = lVar17;
      local_1b0[lVar11 + 2] = lVar20;
      local_1b0[lVar11 + 3] = (lVar15 - iVar1) * lVar20;
      *(undefined8 *)(local_190 + lVar11 * 2) = uVar4;
      local_190[lVar11 * 2 + 2] = iVar1;
      (&uStack_184)[lVar11] = (long)iVar21 + 1U & 0xffffffff | lVar19 << 0x20;
      auStack_17c[lVar11 * 2] = (int)lVar15;
      auStack_17c[lVar11 * 2 + 1] = uVar3;
    }
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x18);
  uVar4 = *(undefined8 *)(fine_region->smallend).vect;
  uVar5 = *(undefined8 *)((fine_region->smallend).vect + 2);
  uStack_2f4 = *(undefined8 *)((fine_region->bigend).vect + 2);
  auStack_2fc[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uVar6 = uStack_2f4;
  uStack_300 = (uint)uVar5;
  auStack_2fc[0] = (uint)((ulong)uVar5 >> 0x20);
  lVar11 = 0;
  uStack_2f4._4_4_ = (uint)((ulong)uStack_2f4 >> 0x20);
  uVar14 = uStack_2f4._4_4_;
  uStack_2f4 = uVar6;
  do {
    uVar13 = 1 << ((byte)lVar11 & 0x1f);
    uVar10 = (uint)lVar11;
    auStack_2fc[lVar11] =
         (auStack_2fc[lVar11] + (uint)((local_288 >> (uVar10 & 0x1f) & 1) != 0)) -
         (uint)((uVar14 >> (uVar10 & 0x1f) & 1) != 0);
    if ((local_288 >> (uVar10 & 0x1f) & 1) == 0) {
      uVar14 = ~uVar13 & uStack_2f4._4_4_;
    }
    else {
      uVar14 = uVar13 | uStack_2f4._4_4_;
    }
    uStack_2f4 = CONCAT44(uVar14,(uint)uStack_2f4);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  uVar5 = *(undefined8 *)(fine_region->smallend).vect;
  uVar6 = *(undefined8 *)((fine_region->smallend).vect + 2);
  uStack_314 = *(undefined8 *)((fine_region->bigend).vect + 2);
  auStack_31c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uVar7 = uStack_314;
  uStack_320 = (uint)uVar6;
  auStack_31c[0] = (uint)((ulong)uVar6 >> 0x20);
  lVar11 = 0;
  uStack_314._4_4_ = (uint)((ulong)uStack_314 >> 0x20);
  uVar14 = uStack_314._4_4_;
  uStack_314 = uVar7;
  do {
    uVar13 = 1 << ((byte)lVar11 & 0x1f);
    uVar10 = (uint)lVar11;
    auStack_31c[lVar11] =
         (auStack_31c[lVar11] + (uint)(((uint)uStack_284 >> (uVar10 & 0x1f) & 1) != 0)) -
         (uint)((uVar14 >> (uVar10 & 0x1f) & 1) != 0);
    if (((uint)uStack_284 >> (uVar10 & 0x1f) & 1) == 0) {
      uVar14 = ~uVar13 & uStack_314._4_4_;
    }
    else {
      uVar14 = uVar13 | uStack_314._4_4_;
    }
    uStack_314 = CONCAT44(uVar14,(uint)uStack_314);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  uVar6 = *(undefined8 *)(fine_region->smallend).vect;
  uVar7 = *(undefined8 *)((fine_region->smallend).vect + 2);
  uStack_334 = *(undefined8 *)((fine_region->bigend).vect + 2);
  auStack_33c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uVar8 = uStack_334;
  uStack_340 = (uint)uVar7;
  auStack_33c[0] = (uint)((ulong)uVar7 >> 0x20);
  lVar11 = 0;
  uStack_334._4_4_ = (uint)((ulong)uStack_334 >> 0x20);
  uVar14 = uStack_334._4_4_;
  uStack_334 = uVar8;
  do {
    uVar13 = 1 << ((byte)lVar11 & 0x1f);
    uVar10 = (uint)lVar11;
    auStack_33c[lVar11] =
         (auStack_33c[lVar11] + (uint)((uStack_284._4_4_ >> (uVar10 & 0x1f) & 1) != 0)) -
         (uint)((uVar14 >> (uVar10 & 0x1f) & 1) != 0);
    if ((uStack_284._4_4_ >> (uVar10 & 0x1f) & 1) == 0) {
      uVar14 = ~uVar13 & uStack_334._4_4_;
    }
    else {
      uVar14 = uVar13 | uStack_334._4_4_;
    }
    uStack_334 = CONCAT44(uVar14,(uint)uStack_334);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if ((int)uStack_300 <= (int)(uint)uStack_2f4) {
    local_308 = (uint)uVar4;
    uStack_304 = (uint)((ulong)uVar4 >> 0x20);
    do {
      if ((int)uStack_304 <= (int)auStack_2fc[1]) {
        uVar14 = uStack_304;
        do {
          if ((int)local_308 <= (int)auStack_2fc[0]) {
            iVar1 = ratio->vect[0];
            uVar10 = local_308;
            do {
              if (0 < ncomp) {
                iVar21 = ratio->vect[1];
                iVar2 = ratio->vect[2];
                puVar12 = (undefined8 *)
                          (((long)(int)uVar14 - (long)local_250[1]) * local_270[1] * 8 +
                           ((long)(int)uStack_300 - (long)local_250[2]) * local_270[2] * 8 +
                           (long)(int)uVar10 * 8 + (long)local_250[0] * -8 + local_270[0]);
                lVar11 = local_1b0[0] + (long)local_190[0] * -4;
                uVar18 = (ulong)(uint)ncomp;
                lVar23 = local_f0[0] + (long)local_d0[0] * -8;
                do {
                  uVar13 = uVar10;
                  if (((iVar1 != 1) && (uVar13 = (int)uVar10 >> 2, iVar1 != 4)) &&
                     (uVar13 = (int)uVar10 >> 1, iVar1 != 2)) {
                    if ((int)uVar10 < 0) {
                      uVar13 = ~((int)~uVar10 / iVar1);
                    }
                    else {
                      uVar13 = (int)uVar10 / iVar1;
                    }
                  }
                  if (uVar13 * iVar1 == uVar10) {
                    uVar16 = uVar14;
                    if (((iVar21 != 1) && (uVar16 = (int)uVar14 >> 2, iVar21 != 4)) &&
                       (uVar16 = (int)uVar14 >> 1, iVar21 != 2)) {
                      if ((int)uVar14 < 0) {
                        uVar16 = ~((int)~uVar14 / iVar21);
                      }
                      else {
                        uVar16 = (int)uVar14 / iVar21;
                      }
                    }
                    uVar9 = uStack_300;
                    if (((iVar2 != 1) && (uVar9 = (int)uStack_300 >> 2, iVar2 != 4)) &&
                       (uVar9 = (int)uStack_300 >> 1, iVar2 != 2)) {
                      if ((int)uStack_300 < 0) {
                        uVar9 = ~((int)~uStack_300 / iVar2);
                      }
                      else {
                        uVar9 = (int)uStack_300 / iVar2;
                      }
                    }
                    if ((local_1b0[0] == 0) ||
                       (*(int *)(lVar11 + ((long)(int)uVar9 - (long)local_190[2]) * local_1b0[2] * 4
                                          + ((long)(int)uVar16 - (long)local_190[1]) *
                                            local_1b0[1] * 4 + (long)(int)uVar13 * 4) != 0)) {
                      *puVar12 = *(undefined8 *)
                                  (lVar23 + ((long)(int)uVar9 - (long)local_d0[2]) * local_f0[2] * 8
                                            + ((long)(int)uVar16 - (long)local_d0[1]) *
                                              local_f0[1] * 8 + (long)(int)uVar13 * 8);
                    }
                  }
                  lVar11 = lVar11 + local_1b0[3] * 4;
                  puVar12 = puVar12 + local_270[3];
                  lVar23 = lVar23 + local_f0[3] * 8;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              bVar24 = uVar10 != auStack_2fc[0];
              uVar10 = uVar10 + 1;
            } while (bVar24);
          }
          bVar24 = uVar14 != auStack_2fc[1];
          uVar14 = uVar14 + 1;
        } while (bVar24);
      }
      bVar24 = uStack_300 != (uint)uStack_2f4;
      uStack_300 = uStack_300 + 1;
    } while (bVar24);
  }
  if ((int)uStack_320 <= (int)(uint)uStack_314) {
    local_328 = (uint)uVar5;
    uStack_324 = (uint)((ulong)uVar5 >> 0x20);
    do {
      if ((int)uStack_324 <= (int)auStack_31c[1]) {
        uVar14 = uStack_324;
        do {
          if ((int)local_328 <= (int)auStack_31c[0]) {
            iVar1 = ratio->vect[1];
            uVar10 = local_328;
            do {
              if (0 < ncomp) {
                iVar21 = ratio->vect[0];
                iVar2 = ratio->vect[2];
                puVar12 = (undefined8 *)
                          (((long)(int)uVar14 - (long)local_20c) * local_228 * 8 +
                           ((long)(int)uStack_320 - (long)local_208) * local_220 * 8 +
                           (long)(int)uVar10 * 8 + (long)local_210 * -8 + local_230);
                lVar11 = local_170 + (long)local_150 * -4;
                lVar23 = local_b0 + (long)local_90 * -8;
                uVar18 = (ulong)(uint)ncomp;
                do {
                  uVar13 = uVar14;
                  if (((iVar1 != 1) && (uVar13 = (int)uVar14 >> 2, iVar1 != 4)) &&
                     (uVar13 = (int)uVar14 >> 1, iVar1 != 2)) {
                    if ((int)uVar14 < 0) {
                      uVar13 = ~((int)~uVar14 / iVar1);
                    }
                    else {
                      uVar13 = (int)uVar14 / iVar1;
                    }
                  }
                  if (uVar13 * iVar1 == uVar14) {
                    uVar16 = uVar10;
                    if (((iVar21 != 1) && (uVar16 = (int)uVar10 >> 2, iVar21 != 4)) &&
                       (uVar16 = (int)uVar10 >> 1, iVar21 != 2)) {
                      if ((int)uVar10 < 0) {
                        uVar16 = ~((int)~uVar10 / iVar21);
                      }
                      else {
                        uVar16 = (int)uVar10 / iVar21;
                      }
                    }
                    uVar9 = uStack_320;
                    if (((iVar2 != 1) && (uVar9 = (int)uStack_320 >> 2, iVar2 != 4)) &&
                       (uVar9 = (int)uStack_320 >> 1, iVar2 != 2)) {
                      if ((int)uStack_320 < 0) {
                        uVar9 = ~((int)~uStack_320 / iVar2);
                      }
                      else {
                        uVar9 = (int)uStack_320 / iVar2;
                      }
                    }
                    if ((local_170 == 0) ||
                       (*(int *)(lVar11 + ((long)(int)uVar9 - (long)local_148) * local_160 * 4 +
                                          ((long)(int)uVar13 - (long)local_14c) * local_168 * 4 +
                                          (long)(int)uVar16 * 4) != 0)) {
                      *puVar12 = *(undefined8 *)
                                  (lVar23 + ((long)(int)uVar9 - (long)local_88) * local_a0 * 8 +
                                            ((long)(int)uVar13 - (long)local_8c) * local_a8 * 8 +
                                            (long)(int)uVar16 * 8);
                    }
                  }
                  lVar11 = lVar11 + local_158 * 4;
                  puVar12 = puVar12 + local_218;
                  lVar23 = lVar23 + local_98 * 8;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              bVar24 = uVar10 != auStack_31c[0];
              uVar10 = uVar10 + 1;
            } while (bVar24);
          }
          bVar24 = uVar14 != auStack_31c[1];
          uVar14 = uVar14 + 1;
        } while (bVar24);
      }
      bVar24 = uStack_320 != (uint)uStack_314;
      uStack_320 = uStack_320 + 1;
    } while (bVar24);
  }
  if ((int)uStack_340 <= (int)(uint)uStack_334) {
    local_348 = (uint)uVar6;
    uStack_344 = (uint)((ulong)uVar6 >> 0x20);
    do {
      if ((int)uStack_344 <= (int)auStack_33c[1]) {
        uVar14 = uStack_344;
        do {
          if ((int)local_348 <= (int)auStack_33c[0]) {
            iVar1 = ratio->vect[2];
            uVar10 = local_348;
            do {
              if (0 < ncomp) {
                iVar21 = ratio->vect[0];
                iVar2 = ratio->vect[1];
                puVar12 = (undefined8 *)
                          (((long)(int)uVar14 - (long)local_1cc) * local_1e8 * 8 +
                           ((long)(int)uStack_340 - (long)local_1c8) * (long)local_1e0 * 8 +
                           (long)(int)uVar10 * 8 + (long)local_1d0 * -8 + local_1f0);
                uVar18 = (ulong)(uint)ncomp;
                lVar11 = local_130 + (long)local_110 * -4;
                lVar23 = local_70 + (long)local_50 * -8;
                do {
                  uVar13 = uStack_340;
                  if (((iVar1 != 1) && (uVar13 = (int)uStack_340 >> 2, iVar1 != 4)) &&
                     (uVar13 = (int)uStack_340 >> 1, iVar1 != 2)) {
                    if ((int)uStack_340 < 0) {
                      uVar13 = ~((int)~uStack_340 / iVar1);
                    }
                    else {
                      uVar13 = (int)uStack_340 / iVar1;
                    }
                  }
                  if (uVar13 * iVar1 == uStack_340) {
                    uVar16 = uVar10;
                    if (((iVar21 != 1) && (uVar16 = (int)uVar10 >> 2, iVar21 != 4)) &&
                       (uVar16 = (int)uVar10 >> 1, iVar21 != 2)) {
                      if ((int)uVar10 < 0) {
                        uVar16 = ~((int)~uVar10 / iVar21);
                      }
                      else {
                        uVar16 = (int)uVar10 / iVar21;
                      }
                    }
                    uVar9 = uVar14;
                    if (((iVar2 != 1) && (uVar9 = (int)uVar14 >> 2, iVar2 != 4)) &&
                       (uVar9 = (int)uVar14 >> 1, iVar2 != 2)) {
                      if ((int)uVar14 < 0) {
                        uVar9 = ~((int)~uVar14 / iVar2);
                      }
                      else {
                        uVar9 = (int)uVar14 / iVar2;
                      }
                    }
                    if ((local_130 == 0) ||
                       (*(int *)(lVar11 + ((long)(int)uVar13 - (long)local_108) *
                                          (long)local_120 * 4 +
                                          ((long)(int)uVar9 - (long)local_10c) * local_128 * 4 +
                                          (long)(int)uVar16 * 4) != 0)) {
                      *puVar12 = *(undefined8 *)
                                  (lVar23 + ((long)(int)uVar13 - (long)local_48) * local_60 * 8 +
                                            ((long)(int)uVar9 - (long)local_4c) * local_68 * 8 +
                                            (long)(int)uVar16 * 8);
                    }
                  }
                  lVar11 = lVar11 + (long)local_118 * 4;
                  puVar12 = puVar12 + (long)local_1d8;
                  lVar23 = lVar23 + local_58 * 8;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              bVar24 = uVar10 != auStack_33c[0];
              uVar10 = uVar10 + 1;
            } while (bVar24);
          }
          bVar24 = uVar14 != auStack_33c[1];
          uVar14 = uVar14 + 1;
        } while (bVar24);
      }
      bVar24 = uStack_340 != (uint)uStack_334;
      uStack_340 = uStack_340 + 1;
    } while (bVar24);
  }
  uVar4 = *(undefined8 *)(fine_region->smallend).vect;
  uVar5 = *(undefined8 *)((fine_region->smallend).vect + 2);
  uStack_2f4 = *(undefined8 *)((fine_region->bigend).vect + 2);
  auStack_2fc[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uVar6 = uStack_2f4;
  uStack_300 = (uint)uVar5;
  auStack_2fc[0] = (uint)((ulong)uVar5 >> 0x20);
  lVar11 = 0;
  uStack_2f4._4_4_ = (uint)((ulong)uStack_2f4 >> 0x20);
  uVar14 = uStack_2f4._4_4_;
  uStack_2f4 = uVar6;
  do {
    uVar13 = 1 << ((byte)lVar11 & 0x1f);
    uVar10 = (uint)lVar11;
    auStack_2fc[lVar11] =
         (auStack_2fc[lVar11] + (uint)((local_288 >> (uVar10 & 0x1f) & 1) != 0)) -
         (uint)((uVar14 >> (uVar10 & 0x1f) & 1) != 0);
    if ((local_288 >> (uVar10 & 0x1f) & 1) == 0) {
      uVar14 = ~uVar13 & uStack_2f4._4_4_;
    }
    else {
      uVar14 = uVar13 | uStack_2f4._4_4_;
    }
    uStack_2f4 = CONCAT44(uVar14,(uint)uStack_2f4);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  uVar5 = *(undefined8 *)(fine_region->smallend).vect;
  uVar6 = *(undefined8 *)((fine_region->smallend).vect + 2);
  uStack_314 = *(undefined8 *)((fine_region->bigend).vect + 2);
  auStack_31c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uVar7 = uStack_314;
  uStack_320 = (uint)uVar6;
  auStack_31c[0] = (uint)((ulong)uVar6 >> 0x20);
  lVar11 = 0;
  uStack_314._4_4_ = (uint)((ulong)uStack_314 >> 0x20);
  uVar14 = uStack_314._4_4_;
  uStack_314 = uVar7;
  do {
    uVar13 = 1 << ((byte)lVar11 & 0x1f);
    uVar10 = (uint)lVar11;
    auStack_31c[lVar11] =
         (auStack_31c[lVar11] + (uint)(((uint)uStack_284 >> (uVar10 & 0x1f) & 1) != 0)) -
         (uint)((uVar14 >> (uVar10 & 0x1f) & 1) != 0);
    if (((uint)uStack_284 >> (uVar10 & 0x1f) & 1) == 0) {
      uVar14 = ~uVar13 & uStack_314._4_4_;
    }
    else {
      uVar14 = uVar13 | uStack_314._4_4_;
    }
    uStack_314 = CONCAT44(uVar14,(uint)uStack_314);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  uVar6 = *(undefined8 *)(fine_region->smallend).vect;
  uVar7 = *(undefined8 *)((fine_region->smallend).vect + 2);
  uStack_334 = *(undefined8 *)((fine_region->bigend).vect + 2);
  auStack_33c[1] = (uint)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  uVar8 = uStack_334;
  uStack_340 = (uint)uVar7;
  auStack_33c[0] = (uint)((ulong)uVar7 >> 0x20);
  lVar11 = 0;
  uStack_334._4_4_ = (uint)((ulong)uStack_334 >> 0x20);
  uVar14 = uStack_334._4_4_;
  uStack_334 = uVar8;
  do {
    uVar13 = 1 << ((byte)lVar11 & 0x1f);
    uVar10 = (uint)lVar11;
    auStack_33c[lVar11] =
         (auStack_33c[lVar11] + (uint)((uStack_284._4_4_ >> (uVar10 & 0x1f) & 1) != 0)) -
         (uint)((uVar14 >> (uVar10 & 0x1f) & 1) != 0);
    if ((uStack_284._4_4_ >> (uVar10 & 0x1f) & 1) == 0) {
      uVar14 = ~uVar13 & uStack_334._4_4_;
    }
    else {
      uVar14 = uVar13 | uStack_334._4_4_;
    }
    uStack_334 = CONCAT44(uVar14,(uint)uStack_334);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if ((int)uStack_300 <= (int)(uint)uStack_2f4) {
    uVar14 = (uint)uVar4;
    uStack_304 = (uint)((ulong)uVar4 >> 0x20);
    do {
      if ((int)uStack_304 <= (int)auStack_2fc[1]) {
        uVar10 = uStack_304;
        do {
          if ((int)uVar14 <= (int)auStack_2fc[0]) {
            iVar1 = ratio->vect[0];
            uVar13 = uVar14;
            do {
              if (0 < ncomp) {
                lVar11 = ((long)(int)uVar10 - (long)local_250[1]) * local_270[1] * 8 +
                         ((long)(int)uStack_300 - (long)local_250[2]) * local_270[2] * 8 +
                         (long)local_250[0] * -8 + local_270[0];
                uVar18 = (ulong)(uint)ncomp;
                do {
                  uVar16 = uVar13;
                  if (((iVar1 != 1) && (uVar16 = (int)uVar13 >> 2, iVar1 != 4)) &&
                     (uVar16 = (int)uVar13 >> 1, iVar1 != 2)) {
                    if ((int)uVar13 < 0) {
                      uVar16 = ~((int)~uVar13 / iVar1);
                    }
                    else {
                      uVar16 = (int)uVar13 / iVar1;
                    }
                  }
                  iVar21 = uVar13 - uVar16 * iVar1;
                  if (iVar21 != 0) {
                    dVar25 = (double)iVar21 * (1.0 / (double)iVar1);
                    *(double *)(lVar11 + (long)(int)uVar13 * 8) =
                         (1.0 - dVar25) * *(double *)(lVar11 + (long)(int)(uVar16 * iVar1) * 8) +
                         dVar25 * *(double *)(lVar11 + (long)(int)((uVar16 + 1) * iVar1) * 8);
                  }
                  lVar11 = lVar11 + local_270[3] * 8;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              bVar24 = uVar13 != auStack_2fc[0];
              uVar13 = uVar13 + 1;
            } while (bVar24);
          }
          bVar24 = uVar10 != auStack_2fc[1];
          uVar10 = uVar10 + 1;
        } while (bVar24);
      }
      bVar24 = uStack_300 != (uint)uStack_2f4;
      uStack_300 = uStack_300 + 1;
    } while (bVar24);
  }
  if ((int)uStack_320 <= (int)(uint)uStack_314) {
    uVar14 = (uint)uVar5;
    uStack_324 = (uint)((ulong)uVar5 >> 0x20);
    do {
      if ((int)uStack_324 <= (int)auStack_31c[1]) {
        uVar10 = uStack_324;
        do {
          if ((int)uVar14 <= (int)auStack_31c[0]) {
            iVar1 = ratio->vect[1];
            uVar13 = uVar14;
            do {
              if (0 < ncomp) {
                lVar11 = local_228 * 8;
                lVar23 = (long)(int)uVar13 * 8 +
                         ((long)(int)uStack_320 - (long)local_208) * local_220 * 8 +
                         (long)local_210 * -8 + local_230;
                uVar18 = (ulong)(uint)ncomp;
                do {
                  uVar16 = uVar10;
                  if (((iVar1 != 1) && (uVar16 = (int)uVar10 >> 2, iVar1 != 4)) &&
                     (uVar16 = (int)uVar10 >> 1, iVar1 != 2)) {
                    if ((int)uVar10 < 0) {
                      uVar16 = ~((int)~uVar10 / iVar1);
                    }
                    else {
                      uVar16 = (int)uVar10 / iVar1;
                    }
                  }
                  iVar21 = uVar10 - uVar16 * iVar1;
                  if (iVar21 != 0) {
                    dVar25 = (double)iVar21 * (1.0 / (double)iVar1);
                    *(double *)(lVar23 + ((long)(int)uVar10 - (long)local_20c) * lVar11) =
                         (1.0 - dVar25) *
                         *(double *)(lVar23 + (int)(uVar16 * iVar1 - local_20c) * lVar11) +
                         dVar25 * *(double *)
                                   (lVar23 + (int)((uVar16 + 1) * iVar1 - local_20c) * lVar11);
                  }
                  lVar23 = lVar23 + local_218 * 8;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              bVar24 = uVar13 != auStack_31c[0];
              uVar13 = uVar13 + 1;
            } while (bVar24);
          }
          bVar24 = uVar10 != auStack_31c[1];
          uVar10 = uVar10 + 1;
        } while (bVar24);
      }
      bVar24 = uStack_320 != (uint)uStack_314;
      uStack_320 = uStack_320 + 1;
    } while (bVar24);
  }
  if ((int)uStack_340 <= (int)(uint)uStack_334) {
    uVar14 = (uint)uVar6;
    uStack_344 = (uint)((ulong)uVar6 >> 0x20);
    do {
      if ((int)uStack_344 <= (int)auStack_33c[1]) {
        uVar10 = uStack_344;
        do {
          if ((int)uVar14 <= (int)auStack_33c[0]) {
            iVar1 = ratio->vect[2];
            uVar13 = uVar14;
            do {
              if (0 < ncomp) {
                lVar23 = (long)local_1e0 * 8;
                lVar11 = (long)(int)uVar13 * 8 +
                         ((long)(int)uVar10 - (long)local_1cc) * local_1e8 * 8 +
                         (long)local_1d0 * -8 + local_1f0;
                uVar18 = (ulong)(uint)ncomp;
                do {
                  uVar16 = uStack_340;
                  if (((iVar1 != 1) && (uVar16 = (int)uStack_340 >> 2, iVar1 != 4)) &&
                     (uVar16 = (int)uStack_340 >> 1, iVar1 != 2)) {
                    if ((int)uStack_340 < 0) {
                      uVar16 = ~((int)~uStack_340 / iVar1);
                    }
                    else {
                      uVar16 = (int)uStack_340 / iVar1;
                    }
                  }
                  iVar21 = uStack_340 - uVar16 * iVar1;
                  if (iVar21 != 0) {
                    dVar25 = (double)iVar21 * (1.0 / (double)iVar1);
                    *(double *)(lVar11 + ((long)(int)uStack_340 - (long)local_1c8) * lVar23) =
                         (1.0 - dVar25) *
                         *(double *)(lVar11 + (int)(uVar16 * iVar1 - local_1c8) * lVar23) +
                         dVar25 * *(double *)
                                   (lVar11 + (int)((uVar16 + 1) * iVar1 - local_1c8) * lVar23);
                  }
                  lVar11 = lVar11 + (long)local_1d8 * 8;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              bVar24 = uVar13 != auStack_33c[0];
              uVar13 = uVar13 + 1;
            } while (bVar24);
          }
          bVar24 = uVar10 != auStack_33c[1];
          uVar10 = uVar10 + 1;
        } while (bVar24);
      }
      bVar24 = uStack_340 != (uint)uStack_334;
      uStack_340 = uStack_340 + 1;
    } while (bVar24);
  }
  return;
}

Assistant:

void FaceLinear::interp_arr (Array<FArrayBox*, AMREX_SPACEDIM> const& crse,
                             const int         crse_comp,
                             Array<FArrayBox*, AMREX_SPACEDIM> const& fine,
                             const int         fine_comp,
                             const int         ncomp,
                             const Box&        fine_region,
                             const IntVect&    ratio,
                             Array<IArrayBox*, AMREX_SPACEDIM> const& solve_mask,
                             const Geometry&   /*crse_geom*/,
                             const Geometry&   /*fine_geom*/,
                             Vector<Array<BCRec, AMREX_SPACEDIM> > const& /*bcr*/,
                             const int         /*actual_comp*/,
                             const int         /*actual_state*/,
                             const RunOn       runon)
{
    BL_PROFILE("FaceLinear::interp_arr()");

    Array<IndexType, AMREX_SPACEDIM> types;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
        { types[d].set(d); }

    GpuArray<Array4<const Real>, AMREX_SPACEDIM> crse_arr;
    GpuArray<Array4<Real>, AMREX_SPACEDIM> fine_arr;
    GpuArray<Array4<const int>, AMREX_SPACEDIM> mask_arr;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
    {
        crse_arr[d] = crse[d]->const_array(crse_comp);
        fine_arr[d] = fine[d]->array(fine_comp);
        if (solve_mask[d] != nullptr)
            { mask_arr[d] = solve_mask[d]->const_array(0); }
    }

    //
    // Fill fine ghost faces with piecewise-constant interpolation of coarse data.
    // Operate only on faces that overlap--ie, only fill the fine faces that make up each
    // coarse face, leave the in-between faces alone.
    // The mask ensures we do not overwrite valid fine cells.
    //
    // Fuse the launches, 1 for each dimension, into a single launch.
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_x(i,j,k,n,fine_arr[0],crse_arr[0],mask_arr[0],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_y(i,j,k,n,fine_arr[1],crse_arr[1],mask_arr[1],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_z(i,j,k,n,fine_arr[2],crse_arr[2],mask_arr[2],ratio);
                      }
                  });
              });

    //
    // Interpolate unfilled grow cells using best data from
    // surrounding faces of valid region, and pc-interpd data
    // on fine faces overlaying coarse edges.
    //
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_x(i,j,k,n,fine_arr[0],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_y(i,j,k,n,fine_arr[1],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_z(i,j,k,n,fine_arr[2],ratio);
                      }
                  });
              });
}